

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O3

void nrg::PrioExecution::
     push<void(*)(std::ostream&,int_const&),std::reference_wrapper<std::ostream>,int>
               (Queue *queue,_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *fn
               ,reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param,
               int *param_4)

{
  int iVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  QueueElement local_78;
  int local_50;
  int iStack_4c;
  undefined8 *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 uStack_30;
  
  local_50 = 0;
  iStack_4c = next()::nxt;
  pbVar2 = param->_M_data;
  iVar1 = *param_4;
  local_40 = 0;
  next()::nxt = next()::nxt + 1;
  local_78.what.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr **)
   local_78.what.super__Function_base._M_functor._M_unused._0_8_ = fn;
  *(basic_ostream<char,_std::char_traits<char>_> **)
   ((long)local_78.what.super__Function_base._M_functor._M_unused._0_8_ + 8) = pbVar2;
  *(int *)((long)local_78.what.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = iVar1;
  local_78.id = iStack_4c;
  local_78.prio = local_50;
  local_78.what._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/PrioExecution.h:77:42)>
       ::_M_invoke;
  local_78.what.super__Function_base._M_functor._8_8_ = local_40;
  local_78.what.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/PrioExecution.h:77:42)>
       ::_M_manager;
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48 = (undefined8 *)local_78.what.super__Function_base._M_functor._M_unused._0_8_;
  std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>::
  emplace_back<nrg::PrioExecution::QueueElement>(&queue->c,&local_78);
  std::
  push_heap<__gnu_cxx::__normal_iterator<nrg::PrioExecution::QueueElement*,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>>,std::greater<nrg::PrioExecution::QueueElement>>
            ((queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_78.what.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.what.super__Function_base._M_manager)
              ((_Any_data *)&local_78.what,(_Any_data *)&local_78.what,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = { 0, next(), [=]() { fn(param...); } };
        push(queue, std::move(elem));
    }